

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O1

void embree::SceneGraph::optimize_animation(Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  long *plVar6;
  long *plVar7;
  long *plVar8;
  long *plVar9;
  byte bVar10;
  vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *pvVar11;
  vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *pvVar12;
  ulong uVar13;
  long lVar14;
  Ref<embree::SceneGraph::Node> local_40;
  Ref<embree::SceneGraph::Node> local_38;
  
  if (node->ptr == (Node *)0x0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar3 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x10))(plVar3);
    pNVar1 = (Node *)plVar3[0x13];
    local_38.ptr = pNVar1;
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
    }
    optimize_animation(&local_38);
    if (pNVar1 != (Node *)0x0) {
      (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
    }
    goto LAB_0014bffd;
  }
  if (node->ptr == (Node *)0x0) {
    plVar4 = (long *)0x0;
  }
  else {
    plVar4 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&GroupNode::typeinfo,0);
  }
  if (plVar4 == (long *)0x0) {
    if (node->ptr == (Node *)0x0) {
      plVar5 = (long *)0x0;
    }
    else {
      plVar5 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
    }
    if (plVar5 == (long *)0x0) {
      if (node->ptr == (Node *)0x0) {
        plVar6 = (long *)0x0;
      }
      else {
        plVar6 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
      }
      if (plVar6 == (long *)0x0) {
        if (node->ptr == (Node *)0x0) {
          plVar7 = (long *)0x0;
        }
        else {
          plVar7 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&HairSetNode::typeinfo,0);
        }
        if (plVar7 == (long *)0x0) {
          if (node->ptr == (Node *)0x0) {
            plVar8 = (long *)0x0;
          }
          else {
            plVar8 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&PointSetNode::typeinfo,0);
          }
          if (plVar8 == (long *)0x0) {
            if (node->ptr == (Node *)0x0) {
              plVar9 = (long *)0x0;
            }
            else {
              plVar9 = (long *)__dynamic_cast(node->ptr,&Node::typeinfo,&SubdivMeshNode::typeinfo,0)
              ;
            }
            if (plVar9 != (long *)0x0) {
              (**(code **)(*plVar9 + 0x10))(plVar9);
              pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                         *)plVar9[0xe];
              if (0x20 < (ulong)(plVar9[0xf] - (long)pvVar12)) {
                bVar10 = 1;
                uVar13 = 1;
                lVar14 = 0x20;
                do {
                  bVar2 = operator==(pvVar12,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                              *)(&pvVar12->field_0x0 + lVar14));
                  bVar10 = bVar10 & bVar2;
                  uVar13 = uVar13 + 1;
                  pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                             *)plVar9[0xe];
                  lVar14 = lVar14 + 0x20;
                } while (uVar13 < (ulong)(plVar9[0xf] - (long)pvVar12 >> 5));
                if (bVar10 == 0) goto LAB_0014bfa4;
              }
              std::
              vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                        *)(plVar9 + 0xe),1);
            }
LAB_0014bfa4:
            if (plVar9 != (long *)0x0) {
              (**(code **)(*plVar9 + 0x18))(plVar9);
            }
          }
          else {
            (**(code **)(*plVar8 + 0x10))(plVar8);
            pvVar11 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                      plVar8[0xf];
            if (0x20 < (ulong)(plVar8[0x10] - (long)pvVar11)) {
              bVar10 = 1;
              uVar13 = 1;
              lVar14 = 0x20;
              do {
                bVar2 = operator==(pvVar11,(vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                                            *)(&pvVar11->field_0x0 + lVar14));
                bVar10 = bVar10 & bVar2;
                uVar13 = uVar13 + 1;
                pvVar11 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                           *)plVar8[0xf];
                lVar14 = lVar14 + 0x20;
              } while (uVar13 < (ulong)(plVar8[0x10] - (long)pvVar11 >> 5));
              if (bVar10 == 0) goto LAB_0014bfb3;
            }
            std::
            vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
            ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                      *)(plVar8 + 0xf),1);
          }
LAB_0014bfb3:
          if (plVar8 != (long *)0x0) {
            (**(code **)(*plVar8 + 0x18))();
          }
        }
        else {
          (**(code **)(*plVar7 + 0x10))(plVar7);
          pvVar11 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_> *)
                    plVar7[0xf];
          if (0x20 < (ulong)(plVar7[0x10] - (long)pvVar11)) {
            bVar10 = 1;
            uVar13 = 1;
            lVar14 = 0x20;
            do {
              bVar2 = operator==(pvVar11,(vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                                          *)(&pvVar11->field_0x0 + lVar14));
              bVar10 = bVar10 & bVar2;
              uVar13 = uVar13 + 1;
              pvVar11 = (vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>
                         *)plVar7[0xf];
              lVar14 = lVar14 + 0x20;
            } while (uVar13 < (ulong)(plVar7[0x10] - (long)pvVar11 >> 5));
            if (bVar10 == 0) goto LAB_0014bfc3;
          }
          std::
          vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
          ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                    *)(plVar7 + 0xf),1);
        }
LAB_0014bfc3:
        if (plVar7 != (long *)0x0) {
          (**(code **)(*plVar7 + 0x18))(plVar7);
        }
      }
      else {
        (**(code **)(*plVar6 + 0x10))(plVar6);
        pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                  plVar6[0xe];
        if (0x20 < (ulong)(plVar6[0xf] - (long)pvVar12)) {
          bVar10 = 1;
          uVar13 = 1;
          lVar14 = 0x20;
          do {
            bVar2 = operator==(pvVar12,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                        *)(&pvVar12->field_0x0 + lVar14));
            bVar10 = bVar10 & bVar2;
            uVar13 = uVar13 + 1;
            pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                      plVar6[0xe];
            lVar14 = lVar14 + 0x20;
          } while (uVar13 < (ulong)(plVar6[0xf] - (long)pvVar12 >> 5));
          if (bVar10 == 0) goto LAB_0014bfd2;
        }
        std::
        vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
        ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  *)(plVar6 + 0xe),1);
      }
LAB_0014bfd2:
      if (plVar6 != (long *)0x0) {
        (**(code **)(*plVar6 + 0x18))(plVar6);
      }
    }
    else {
      (**(code **)(*plVar5 + 0x10))(plVar5);
      pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                plVar5[0xe];
      if (0x20 < (ulong)(plVar5[0xf] - (long)pvVar12)) {
        bVar10 = 1;
        uVar13 = 1;
        lVar14 = 0x20;
        do {
          bVar2 = operator==(pvVar12,(vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>
                                      *)(&pvVar12->field_0x0 + lVar14));
          bVar10 = bVar10 & bVar2;
          uVar13 = uVar13 + 1;
          pvVar12 = (vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_> *)
                    plVar5[0xe];
          lVar14 = lVar14 + 0x20;
        } while (uVar13 < (ulong)(plVar5[0xf] - (long)pvVar12 >> 5));
        if (bVar10 == 0) goto LAB_0014bfe1;
      }
      std::
      vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ::resize((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                *)(plVar5 + 0xe),1);
    }
LAB_0014bfe1:
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x18))(plVar5);
    }
  }
  else {
    (**(code **)(*plVar4 + 0x10))(plVar4);
    plVar5 = (long *)plVar4[0xd];
    plVar6 = (long *)plVar4[0xe];
    if (plVar5 != plVar6) {
      do {
        pNVar1 = (Node *)*plVar5;
        local_40.ptr = pNVar1;
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[2])(pNVar1);
        }
        optimize_animation(&local_40);
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[3])(pNVar1);
        }
        plVar5 = plVar5 + 1;
      } while (plVar5 != plVar6);
    }
  }
  if (plVar4 != (long *)0x0) {
    (**(code **)(*plVar4 + 0x18))(plVar4);
  }
LAB_0014bffd:
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 0x18))(plVar3);
  }
  return;
}

Assistant:

void SceneGraph::optimize_animation(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) 
      optimize_animation(xfmNode->child);

    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (const auto& child : groupNode->children) 
        optimize_animation(child);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
  }